

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O2

int __thiscall
booster::aio::basic_socket::get_option(basic_socket *this,integer_option_type opt,error_code *e)

{
  native_type __fd;
  int iVar1;
  error_code eVar2;
  int value;
  socklen_t len;
  
  value = 0;
  len = 4;
  if (opt == receive_buffer_size) {
    iVar1 = 8;
  }
  else {
    if (opt != send_buffer_size) {
      return 0;
    }
    iVar1 = 7;
  }
  __fd = basic_io_device::native(&this->super_basic_io_device);
  iVar1 = getsockopt(__fd,1,iVar1,&value,&len);
  if (iVar1 < 0) {
    eVar2 = socket_details::geterror();
    e->_M_value = eVar2._M_value;
    e->_M_cat = eVar2._M_cat;
    value = 0;
  }
  return value;
}

Assistant:

int basic_socket::get_option(integer_option_type opt,system::error_code &e)
{
	int value = 0;
	socklen_t len = sizeof(value);
	#ifdef BOOSTER_WIN32
	char *ptr = reinterpret_cast<char *>(&value);
	#else
	int *ptr = &value;
	#endif
	int res = 0;
	switch(opt) {
	case receive_buffer_size:
		res=::getsockopt(native(),SOL_SOCKET,SO_RCVBUF,ptr,&len);
		break;
	case send_buffer_size:
		res=::getsockopt(native(),SOL_SOCKET,SO_SNDBUF,ptr,&len);
		break;
	default:
		;
	}
	if(res < 0) {
		e=geterror();
		return false;
	}
	return value;
}